

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

iterator * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::end_related
          (iterator *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,
          Bucket *start)

{
  iterator iVar1;
  BucketIterator end;
  
  iVar1 = getItFor(this,start);
  end._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  EdgeIterator::EdgeIterator(__return_storage_ptr__,end);
  return __return_storage_ptr__;
}

Assistant:

iterator end_related(const Bucket &start) const {
        auto endIt = ++getItFor(start);
        return iterator(endIt);
    }